

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

int __thiscall icu_63::ReorderingBuffer::init(ReorderingBuffer *this,EVP_PKEY_CTX *ctx)

{
  uint8_t uVar1;
  byte bVar2;
  int32_t iVar3;
  int32_t iVar4;
  char16_t *pcVar5;
  ReorderingBuffer *in_RDX;
  int32_t length;
  UErrorCode *errorCode_local;
  int32_t destCapacity_local;
  ReorderingBuffer *this_local;
  
  iVar3 = UnicodeString::length(this->str);
  pcVar5 = UnicodeString::getBuffer(this->str,(int32_t)ctx);
  this->start = pcVar5;
  if (this->start == (UChar *)0x0) {
    *(undefined4 *)&in_RDX->impl = 7;
    this_local._7_1_ = 0;
    this = in_RDX;
  }
  else {
    this->limit = this->start + iVar3;
    iVar4 = UnicodeString::getCapacity(this->str);
    this->remainingCapacity = iVar4 - iVar3;
    this->reorderStart = this->start;
    if (this->start == this->limit) {
      this->lastCC = '\0';
    }
    else {
      setIterator(this);
      uVar1 = previousCC(this);
      this->lastCC = uVar1;
      bVar2 = this->lastCC;
      while (1 < bVar2) {
        bVar2 = previousCC(this);
      }
      this->reorderStart = this->codePointLimit;
    }
    this_local._7_1_ = 1;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

UBool ReorderingBuffer::init(int32_t destCapacity, UErrorCode &errorCode) {
    int32_t length=str.length();
    start=str.getBuffer(destCapacity);
    if(start==NULL) {
        // getBuffer() already did str.setToBogus()
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    limit=start+length;
    remainingCapacity=str.getCapacity()-length;
    reorderStart=start;
    if(start==limit) {
        lastCC=0;
    } else {
        setIterator();
        lastCC=previousCC();
        // Set reorderStart after the last code point with cc<=1 if there is one.
        if(lastCC>1) {
            while(previousCC()>1) {}
        }
        reorderStart=codePointLimit;
    }
    return TRUE;
}